

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_handle_graph.cpp
# Opt level: O3

path_handle_t __thiscall
handlegraph::MutablePathHandleGraph::rename_path
          (MutablePathHandleGraph *this,path_handle_t *path_handle,string *new_name)

{
  size_t __n;
  undefined1 uVar1;
  int iVar2;
  path_handle_t *ppVar3;
  bool bVar4;
  path_handle_t renamed;
  handle_t handle;
  iterator __begin1;
  iterator __end1;
  path_handle_t local_90;
  char local_88 [8];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  iterator local_60;
  PathForEachSocket local_40;
  
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0xb8))
            (local_80,&this->field_0x0 + *(long *)(*(long *)this + -0x168),path_handle);
  __n = new_name->_M_string_length;
  if (__n == local_80._8_8_) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp((new_name->_M_dataplus)._M_p,(void *)local_80._0_8_,__n);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((undefined1 **)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_70[0] + 1));
  }
  ppVar3 = path_handle;
  if (!bVar4) {
    local_90.data = (char  [8])(**(code **)(*(long *)this + 0x158))(this,new_name,0);
    local_40 = PathHandleGraph::scan_path
                         ((PathHandleGraph *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)),
                          path_handle);
    PathForEachSocket::begin((iterator *)local_80,&local_40);
    PathForEachSocket::end(&local_60,&local_40);
    bVar4 = PathForEachSocket::iterator::operator!=((iterator *)local_80,&local_60);
    if (bVar4) {
      do {
        local_88 = (char  [8])PathForEachSocket::iterator::operator*((iterator *)local_80);
        (**(code **)(*(long *)this + 0x168))(this,&local_90,local_88);
        PathForEachSocket::iterator::operator++((iterator *)local_80);
        bVar4 = PathForEachSocket::iterator::operator!=((iterator *)local_80,&local_60);
      } while (bVar4);
    }
    uVar1 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0xc0))
                      (&this->field_0x0 + *(long *)(*(long *)this + -0x168),path_handle);
    ppVar3 = &local_90;
    (**(code **)(*(long *)this + 400))(this,ppVar3,uVar1);
    (**(code **)(*(long *)this + 0x148))(this,path_handle);
  }
  return (path_handle_t)*&ppVar3->data;
}

Assistant:

path_handle_t MutablePathHandleGraph::rename_path(const path_handle_t& path_handle,
                                                  const std::string& new_name) {
    if (new_name == get_path_name(path_handle)) {
        return path_handle;
    }
    // if no overwritten implementation, just copy the path
    path_handle_t renamed = create_path_handle(new_name);
    for (handle_t handle : scan_path(path_handle)) {
        append_step(renamed, handle);
    }
    set_circularity(renamed, get_is_circular(path_handle));
    destroy_path(path_handle);
    return renamed;
}